

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

bool __thiscall QProcessPrivate::openChannels(QProcessPrivate *this)

{
  bool bVar1;
  
  if (this->inputChannelMode == '\x01') {
    if ((this->stdinChannel).type != Normal) {
      openChannels();
    }
LAB_00429e30:
    if ((this->processChannelMode & 0xfe) == 2) {
      if ((this->stdoutChannel).type != Normal) {
        openChannels();
      }
    }
    else {
      bVar1 = openChannel(this,&this->stdoutChannel);
      if (!bVar1) goto LAB_00429e95;
    }
    if ((this->processChannelMode < 5) && ((0x16U >> (this->processChannelMode & 0x1f) & 1) != 0)) {
      if ((this->stderrChannel).type != Normal) {
        openChannels();
      }
    }
    else {
      bVar1 = openChannel(this,&this->stderrChannel);
      if (!bVar1) goto LAB_00429e95;
    }
    bVar1 = true;
  }
  else {
    bVar1 = openChannel(this,&this->stdinChannel);
    if (bVar1) goto LAB_00429e30;
LAB_00429e95:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool QProcessPrivate::openChannels()
{
    // stdin channel.
    if (inputChannelMode == QProcess::ForwardedInputChannel) {
        if (stdinChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stdin channel configuration");
    } else if (!openChannel(stdinChannel)) {
        return false;
    }

    // stdout channel.
    if (processChannelMode == QProcess::ForwardedChannels
            || processChannelMode == QProcess::ForwardedOutputChannel) {
        if (stdoutChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stdout channel configuration");
    } else if (!openChannel(stdoutChannel)) {
        return false;
    }

    // stderr channel.
    if (processChannelMode == QProcess::ForwardedChannels
            || processChannelMode == QProcess::ForwardedErrorChannel
            || processChannelMode == QProcess::MergedChannels) {
        if (stderrChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stderr channel configuration");
    } else if (!openChannel(stderrChannel)) {
        return false;
    }

    return true;
}